

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O1

void __thiscall slang::assert::AssertionException::~AssertionException(AssertionException *this)

{
  std::logic_error::~logic_error(&this->super_logic_error);
  mi_free_size(this,0x10);
  return;
}

Assistant:

class SLANG_EXPORT AssertionException : public std::logic_error {
public:
    AssertionException(const std::string& message) : std::logic_error(message) {}
};

/// A handler that runs when an ASSERT condition fails; it will unconditionally
/// throw an exception.
[[noreturn]] SLANG_EXPORT void assertFailed(const char* expr, const std::source_location& location);

/// A handler that runs when an exception is thrown but exceptions are disabled; it will
/// unconditionally abort the program.
[[noreturn]] SLANG_EXPORT void handleThrow(const char* msg, const std::source_location& location);

/// A handler that runs when a code path is reached that is supposed to be unreachable.
/// An exception will be thrown or the program will be aborted.
[[noreturn]] SLANG_EXPORT void handleUnreachable(const std::source_location& location);
}